

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCMapping.c
# Opt level: O0

_Bool PPC_alias_insn(char *name,ppc_alias *alias)

{
  int iVar1;
  name_map *in_RSI;
  char *in_RDI;
  int x;
  size_t i;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  ulong uVar2;
  
  uVar2 = 0;
  while( true ) {
    if (0x4f < uVar2) {
      iVar1 = name2id(in_RSI,(int)(uVar2 >> 0x20),
                      (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      if (iVar1 != -1) {
        in_RSI->id = insn_name_maps[iVar1].id;
        *(undefined4 *)&in_RSI->field_0x4 = 0;
      }
      return iVar1 != -1;
    }
    iVar1 = strcmp(in_RDI,alias_insn_name_maps[uVar2].mnem);
    if (iVar1 == 0) break;
    uVar2 = uVar2 + 1;
  }
  in_RSI->id = alias_insn_name_maps[uVar2].id;
  *(int *)&in_RSI->field_0x4 = alias_insn_name_maps[uVar2].cc;
  return true;
}

Assistant:

bool PPC_alias_insn(const char *name, struct ppc_alias *alias)
{
	size_t i;
#ifndef CAPSTONE_DIET
	int x;
#endif

	for(i = 0; i < ARR_SIZE(alias_insn_name_maps); i++) {
		if (!strcmp(name, alias_insn_name_maps[i].mnem)) {
			alias->id = alias_insn_name_maps[i].id;
			alias->cc = alias_insn_name_maps[i].cc;
			return true;
		}
	}

#ifndef CAPSTONE_DIET
	// not really an alias insn
	x = name2id(&insn_name_maps[1], ARR_SIZE(insn_name_maps) - 1, name);
	if (x != -1) {
		alias->id = insn_name_maps[x].id;
		alias->cc = PPC_BC_INVALID;
		return true;
	}
#endif

	// not found
	return false;
}